

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

void outblank_stream(out_stream_info *stream)

{
  char *in_RDI;
  int in_stack_0000000c;
  out_stream_info *in_stack_00000010;
  int *in_stack_00000808;
  char *in_stack_00000810;
  int in_stack_0000081c;
  out_stream_info *in_stack_00000820;
  
  outflushn_stream(in_stack_00000010,in_stack_0000000c);
  if ((*(int *)(in_RDI + 0x284c) != 0) && (*(int *)(in_RDI + 0x2844) != 0)) {
    outstring_stream(stream,in_RDI);
  }
  t_outline(in_stack_00000820,in_stack_0000081c,in_stack_00000810,in_stack_00000808);
  return;
}

Assistant:

static void outblank_stream(out_stream_info *stream)
{
    /* flush the stream */
    outflushn_stream(stream, 1);

    /* if generating for an HTML display target, add an HTML line break */
    if (stream->html_mode && stream->html_target)
        outstring_stream(stream, "<BR>");

    /* write out the newline */
    t_outline(stream, 1, "\n", 0);
}